

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

void VP8LClearBackwardRefs(VP8LBackwardRefs *refs)

{
  if (refs->tail != (PixOrCopyBlock **)0x0) {
    *refs->tail = refs->free_blocks;
  }
  refs->free_blocks = refs->refs;
  refs->tail = &refs->refs;
  refs->last_block = (PixOrCopyBlock *)0x0;
  refs->refs = (PixOrCopyBlock *)0x0;
  return;
}

Assistant:

void VP8LClearBackwardRefs(VP8LBackwardRefs* const refs) {
  assert(refs != NULL);
  if (refs->tail != NULL) {
    *refs->tail = refs->free_blocks;  // recycle all blocks at once
  }
  refs->free_blocks = refs->refs;
  refs->tail = &refs->refs;
  refs->last_block = NULL;
  refs->refs = NULL;
}